

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O1

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  bool bVar1;
  double dVar2;
  char *__dest;
  size_t sVar3;
  ulong elementCount;
  char *pcVar4;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *e;
  anon_union_32_1_a8c68091_for_NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_2
  *paVar5;
  Array<char> buf_heap;
  char buf_stack [128];
  char *pcVar6;
  ulong uVar7;
  undefined8 *local_d8;
  StringPtr local_c8;
  char local_b8 [136];
  
  sVar3 = digits->size_ + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar3 = digits->size_;
  }
  if ((exponent->ptr).isSet == true) {
    sVar3 = sVar3 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  elementCount = sVar3 + 1;
  if (elementCount < 0x81) {
    pcVar6 = (char *)0x0;
    uVar7 = 0;
    local_d8 = (undefined8 *)0x0;
    __dest = local_b8;
  }
  else {
    __dest = (char *)kj::_::HeapArrayDisposer::allocateImpl
                               (1,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    local_d8 = &kj::_::HeapArrayDisposer::instance;
    pcVar6 = __dest;
    uVar7 = elementCount;
  }
  memcpy(__dest,digits->ptr,digits->size_);
  pcVar4 = __dest + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar4 = '.';
    memcpy(pcVar4 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar4 = pcVar4 + 1 + (fraction->ptr).field_1.value.size_;
  }
  bVar1 = (exponent->ptr).isSet;
  paVar5 = (anon_union_32_1_a8c68091_for_NullableValue<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_>_2
            *)0x0;
  if (bVar1 != false) {
    paVar5 = &(exponent->ptr).field_1;
  }
  if (bVar1 == true) {
    *pcVar4 = 'e';
    if ((paVar5->value).impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar4 + 1) =
           (paVar5->value).impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.field_1;
      pcVar4 = pcVar4 + 2;
    }
    else {
      pcVar4 = pcVar4 + 1;
    }
    memcpy(pcVar4,*(void **)((long)paVar5 + 8),*(size_t *)((long)paVar5 + 0x10));
    pcVar4 = pcVar4 + *(long *)((long)paVar5 + 0x10);
  }
  *pcVar4 = '\0';
  local_c8.content.ptr = __dest;
  local_c8.content.size_ = elementCount;
  dVar2 = StringPtr::parseAs<double>(&local_c8);
  if (pcVar6 != (char *)0x0) {
    (**(code **)*local_d8)(local_d8,pcVar6,1,uVar7,uVar7,0,0,0);
  }
  return dVar2;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_SOME(f, fraction) {
    bufSize += 1 + f.size();
  }
  KJ_IF_SOME(e, exponent) {
    bufSize += 1 + (get<0>(e) != kj::none) + get<1>(e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_SOME(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f.begin(), f.size());
    pos += f.size();
  }
  KJ_IF_SOME(e, exponent) {
    *pos++ = 'e';
    KJ_IF_SOME(sign, get<0>(e)) {
      *pos++ = sign;
    }
    memcpy(pos, get<1>(e).begin(), get<1>(e).size());
    pos += get<1>(e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  // The above construction should always produce a valid double, so this should never throw...
  return StringPtr(buf.begin(), bufSize).parseAs<double>();
}